

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_type.hpp
# Opt level: O2

DataType csv::internals::_determine_integral_type(longdouble *number)

{
  longdouble lVar1;
  DataType DVar2;
  
  lVar1 = *number;
  if (lVar1 < (longdouble)0) {
    __assert_fail("number >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/vincentlaucsb[P]csv-parser/include/internal/data_type.hpp"
                  ,0xd6,"DataType csv::internals::_determine_integral_type(const long double &)");
  }
  if (lVar1 <= (longdouble)127.0) {
    DVar2 = CSV_INT8;
  }
  else if (lVar1 <= (longdouble)32767.0) {
    DVar2 = CSV_INT16;
  }
  else {
    if ((longdouble)2147483647.0 < lVar1) {
      return (uint)(_DAT_00195080 < lVar1) + CSV_INT64;
    }
    DVar2 = CSV_INT32;
  }
  return DVar2;
}

Assistant:

HEDLEY_PRIVATE HEDLEY_PURE CONSTEXPR_14
        DataType _determine_integral_type(const long double& number) noexcept {
            // We can assume number is always non-negative
            assert(number >= 0);

            if (number <= internals::CSV_INT8_MAX)
                return DataType::CSV_INT8;
            else if (number <= internals::CSV_INT16_MAX)
                return DataType::CSV_INT16;
            else if (number <= internals::CSV_INT32_MAX)
                return DataType::CSV_INT32;
            else if (number <= internals::CSV_INT64_MAX)
                return DataType::CSV_INT64;
            else // Conversion to long long will cause an overflow
                return DataType::CSV_BIGINT;
        }